

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
* __thiscall
flow::IRProgram::
get<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
          *table,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal)

{
  pointer puVar1;
  __type_conflict2 _Var2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar3 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  lVar4 = 0;
  do {
    if ((long)puVar3 - (long)puVar1 >> 3 == lVar4) {
      std::
      make_unique<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::__cxx11::string_const&>
                (&local_50);
      std::
      vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>,std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>,std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>,std::default_delete<flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>>>>
                  *)table,(unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                           *)&local_50);
      if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
      puVar3 = (table->
               super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_0013f34b:
      return (puVar3->_M_t).
             super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
             .
             super__Head_base<0UL,_flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_*,_false>
             ._M_head_impl;
    }
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               ((long)(table->
                      super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar4]._M_t.
                      super___uniq_ptr_impl<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>
                      ._M_t + 0x48));
    _Var2 = std::operator==(&local_50,literal);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) {
      puVar3 = (pointer)((long)(table->
                               super__Vector_base<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>,_std::default_delete<flow::ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start - lVar5);
      goto LAB_0013f34b;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + -8;
  } while( true );
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}